

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3DeleteColumnNames(sqlite3 *db,Table *pTable)

{
  int iVar1;
  Column *pCVar2;
  
  pCVar2 = pTable->aCol;
  if (pCVar2 != (Column *)0x0) {
    for (iVar1 = 0; iVar1 < pTable->nCol; iVar1 = iVar1 + 1) {
      sqlite3DbFree(db,pCVar2->zName);
      sqlite3ExprDelete(db,pCVar2->pDflt);
      sqlite3DbFree(db,pCVar2->zColl);
      pCVar2 = pCVar2 + 1;
    }
    sqlite3DbFree(db,pTable->aCol);
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DeleteColumnNames(sqlite3 *db, Table *pTable){
  int i;
  Column *pCol;
  assert( pTable!=0 );
  if( (pCol = pTable->aCol)!=0 ){
    for(i=0; i<pTable->nCol; i++, pCol++){
      sqlite3DbFree(db, pCol->zName);
      sqlite3ExprDelete(db, pCol->pDflt);
      sqlite3DbFree(db, pCol->zColl);
    }
    sqlite3DbFree(db, pTable->aCol);
  }
}